

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O2

void __thiscall QFormLayoutPrivate::calcSizeHints(QFormLayoutPrivate *this)

{
  QLayoutStruct *pQVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  int bottomMargin;
  int rightMargin;
  int topMargin;
  int leftMargin;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = -0x55555556;
  local_40 = -0x55555556;
  local_44 = -0x55555556;
  local_48 = -0x55555556;
  QLayout::getContentsMargins
            (*(QLayout **)&(this->super_QLayoutPrivate).field_0x8,&local_3c,&local_40,&local_44,
             &local_48);
  updateSizes(this);
  setupVerticalLayoutData(this,0x7ffff);
  iVar2 = local_48 + local_40;
  pQVar1 = (this->vLayouts).d.ptr;
  uVar7 = 0;
  uVar6 = (ulong)(uint)this->vLayoutCount;
  if (this->vLayoutCount < 1) {
    uVar6 = uVar7;
  }
  iVar5 = iVar2;
  for (; uVar6 * 0x20 != uVar7; uVar7 = uVar7 + 0x20) {
    iVar3 = *(int *)((long)&pQVar1->spacing + uVar7);
    iVar5 = iVar5 + iVar3 + *(int *)((long)&pQVar1->sizeHint + uVar7);
    iVar2 = iVar2 + iVar3 + *(int *)((long)&pQVar1->minimumSize + uVar7);
  }
  iVar4 = this->min_width + local_44 + local_3c;
  iVar3 = local_44 + local_3c + this->sh_width;
  if (0x7fffe < iVar4) {
    iVar4 = 0x7ffff;
  }
  (this->minSize).wd.m_i = iVar4;
  if (0x7fffe < iVar2) {
    iVar2 = 0x7ffff;
  }
  (this->minSize).ht.m_i = iVar2;
  if (0x7fffe < iVar3) {
    iVar3 = 0x7ffff;
  }
  (this->prefSize).wd.m_i = iVar3;
  iVar2 = 0x7ffff;
  if (iVar5 < 0x7ffff) {
    iVar2 = iVar5;
  }
  (this->prefSize).ht.m_i = iVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFormLayoutPrivate::calcSizeHints()
{
    Q_Q(QFormLayout);

    int leftMargin, topMargin, rightMargin, bottomMargin;
    q->getContentsMargins(&leftMargin, &topMargin, &rightMargin, &bottomMargin);

    updateSizes();
    setupVerticalLayoutData(QLAYOUTSIZE_MAX);
    // Don't need to call setupHorizontal here

    int h = topMargin + bottomMargin;
    int mh = topMargin + bottomMargin;

    // The following are set in updateSizes
    int w = sh_width + leftMargin + rightMargin;
    int mw = min_width + leftMargin + rightMargin;

    for (int i = 0; i < vLayoutCount; ++i) {
        int spacing = vLayouts.at(i).spacing;
        h += vLayouts.at(i).sizeHint + spacing;
        mh += vLayouts.at(i).minimumSize + spacing;
    }

    minSize.rwidth() = qMin(mw, QLAYOUTSIZE_MAX);
    minSize.rheight() = qMin(mh, QLAYOUTSIZE_MAX);
    prefSize.rwidth() = qMin(w, QLAYOUTSIZE_MAX);
    prefSize.rheight() = qMin(h, QLAYOUTSIZE_MAX);
}